

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

bool ReadChars(char **stuff,int size)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  
  pcVar2 = *stuff;
  pcVar1 = PatchPt;
  if (size != 0) {
    cVar3 = *PatchPt;
    do {
      if (cVar3 != '\r') {
        *pcVar2 = cVar3;
        pcVar2 = pcVar2 + 1;
        size = size + -1;
        pcVar1 = PatchPt + 1;
        if (size == 0) break;
      }
      PatchPt = PatchPt + 1;
      cVar3 = *PatchPt;
      pcVar1 = PatchPt;
    } while (cVar3 != '\0');
  }
  PatchPt = pcVar1;
  *pcVar2 = '\0';
  return SUB81(pcVar2,0);
}

Assistant:

static bool ReadChars (char **stuff, int size)
{
	char *str = *stuff;

	if (!size) {
		*str = 0;
		return true;
	}

	do {
		// Ignore carriage returns
		if (*PatchPt != '\r')
			*str++ = *PatchPt;
		else
			size++;

		PatchPt++;
	} while (--size && *PatchPt != 0);

	*str = 0;
	return true;
}